

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

monst * makemon(permonst *ptr,level *lev,int x,int y,int mmflags)

{
  d_level *pdVar1;
  byte *pbVar2;
  level *lev_00;
  boolean bVar3;
  byte bVar4;
  char cVar5;
  xchar xVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  monst *pmVar16;
  char *pcVar17;
  permonst *ppVar18;
  obj *poVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  permonst *ptr_00;
  bool bVar23;
  bool bVar24;
  xchar local_d8;
  coord bypos;
  
  uVar21 = (ulong)(uint)x;
  iVar9 = (int)u.ux;
  bVar23 = u.uy == y;
  uVar20 = mmflags & 0x80;
  if (y == 0 && x == 0) {
    pmVar16 = (monst *)&bypos;
    if (ptr == (permonst *)0x0) {
      pmVar16 = (monst *)0x0;
    }
    uVar15 = 0;
    while( true ) {
      uVar12 = mt_random();
      uVar21 = (ulong)uVar12 % 0x4d + 2;
      uVar12 = mt_random();
      y = uVar12 % 0x15;
      bVar3 = goodpos(lev,(int)uVar21,y,pmVar16,uVar20);
      if ((bVar3 != '\0' || 99 < uVar15) &&
         (((in_mklev != '\0' || (0x31 < uVar15)) || ((viz_array[(uint)y][uVar21] & 2U) == 0))))
      break;
      uVar15 = uVar15 + 1;
    }
    bVar24 = uVar15 < 99;
  }
  else {
    bVar24 = true;
    if (in_mklev == '\0' && (bVar23 && iVar9 == x)) {
      bVar3 = enexto_core(&bypos,lev,u.ux,u.uy,ptr,uVar20);
      if (bVar3 == '\0') {
        return (monst *)0x0;
      }
      uVar21 = (ulong)(uint)(int)bypos.x;
      y = (int)bypos.y;
    }
  }
  iVar22 = (int)uVar21;
  pmVar16 = lev->monsters[iVar22][y];
  if (((pmVar16 != (monst *)0x0) && ((pmVar16->field_0x61 & 2) == 0)) || (!bVar24)) {
    if (((uint)mmflags >> 8 & 1) == 0) {
      return (monst *)0x0;
    }
    local_d8 = (xchar)y;
    bVar3 = enexto_core(&bypos,lev,(xchar)uVar21,local_d8,ptr,uVar20);
    if (bVar3 == '\0') {
      return (monst *)0x0;
    }
    iVar22 = (int)bypos.x;
    y = (int)bypos.y;
  }
  if (ptr == (permonst *)0x0) {
    uVar15 = 0;
    do {
      ptr_00 = rndmonst(lev);
      if (ptr_00 == (permonst *)0x0) {
        return (monst *)0x0;
      }
      bVar3 = goodpos(lev,iVar22,y,(monst *)&bypos,uVar20);
    } while ((bVar3 == '\0') && (bVar24 = uVar15 < 0x32, uVar15 = uVar15 + 1, bVar24));
    iVar10 = monsndx(ptr_00);
  }
  else {
    iVar10 = monsndx(ptr);
    ptr_00 = ptr;
    if ((mvitals[iVar10].mvflags & 2) != 0) {
      return (monst *)0x0;
    }
  }
  sVar7 = quest_info(0x1f);
  if (iVar10 == sVar7) {
    ptr_00 = &pm_leader;
  }
  else {
    sVar7 = quest_info(0x21);
    if (iVar10 == sVar7) {
      ptr_00 = &pm_guardian;
    }
    else {
      sVar7 = quest_info(0x20);
      if (iVar10 == sVar7) {
        ptr_00 = &pm_nemesis;
      }
    }
  }
  propagate(iVar10,(mmflags & 0x40U) == 0,'\0');
  if ((mmflags & 4U) == 0) {
    iVar11 = 2;
    if ((mmflags & 8U) == 0) {
      iVar11 = (int)ptr_00->pxtyp;
    }
  }
  else {
    iVar11 = 3;
  }
  pmVar16 = newmonst(iVar11,0);
  pmVar16->nmon = lev->monlist;
  lev->monlist = pmVar16;
  uVar15 = flags.ident;
  uVar20 = flags.ident + 1;
  uVar12 = uVar20;
  pmVar16->m_id = flags.ident;
  flags.ident = uVar12;
  if (uVar15 == 0) {
    flags.ident = 2;
    pmVar16->m_id = uVar20;
  }
  set_mon_data(pmVar16,ptr_00,0);
  if (pmVar16->data->msound == '\x1f') {
    quest_status.leader_m_id = pmVar16->m_id;
  }
  pmVar16->mnum = (short)iVar10;
  pdVar1 = &lev->z;
  uVar20 = adj_lev(pdVar1,ptr_00);
  pmVar16->m_lev = (uchar)uVar20;
  if (ptr_00->mlet == '7') {
    iVar11 = golemhp(iVar10);
LAB_001b3d73:
    pmVar16->mhp = iVar11;
    pmVar16->mhpmax = iVar11;
  }
  else {
    if (ptr_00 == mons + 0x145 || (ptr_00 == mons + 0x146 || ptr_00 == mons + 0x144)) {
      iVar11 = dice(8,8);
      iVar11 = iVar11 + 100;
      goto LAB_001b3d73;
    }
    if (ptr_00->mlevel < '2') {
      if ((iVar10 < 0x93 || ptr_00->mlet != '\x1e') ||
         (pdVar1->dnum != dungeon_topology.d_astral_level.dnum)) {
        if ((uchar)uVar20 == '\0') {
          iVar11 = rnd(4);
        }
        else if (ptr_00->msound == '\x1f') {
          iVar11 = rnd(0x1e);
          iVar11 = iVar11 + 0x87;
        }
        else {
          uVar21 = (ulong)pmVar16->data->msize;
          if (uVar21 < 8) {
            iVar11 = *(int *)(&DAT_0029cbec + uVar21 * 4);
          }
          else {
            iVar11 = 8;
          }
          iVar11 = dice(uVar20 & 0xff,iVar11);
          pmVar16->mhp = iVar11;
          pmVar16->mhpmax = iVar11;
          bVar3 = is_home_elemental(pdVar1,ptr_00);
          if (bVar3 == '\0') goto LAB_001b3d7d;
          iVar11 = pmVar16->mhp * 3;
        }
      }
      else {
        iVar11 = dice(uVar20 & 0xff,8);
        iVar11 = iVar11 + (uVar20 & 0xff) * 7;
      }
      goto LAB_001b3d73;
    }
    iVar11 = (uint)(byte)ptr_00->mlevel * 2 + -0xc;
    pmVar16->mhp = iVar11;
    pmVar16->mhpmax = iVar11;
    pmVar16->m_lev = (byte)iVar11 >> 2;
  }
LAB_001b3d7d:
  if ((ptr_00->mflags2 >> 0x11 & 1) == 0) {
    if ((ptr_00->mflags2 >> 0x10 & 1) == 0) {
      uVar20 = mt_random();
      *(uint *)&pmVar16->field_0x60 = *(uint *)&pmVar16->field_0x60 & 0xfffffffe | uVar20 & 1;
    }
    else {
      pmVar16->field_0x60 = pmVar16->field_0x60 & 0xfe;
    }
  }
  else {
    pmVar16->field_0x60 = pmVar16->field_0x60 | 1;
  }
  if ((pdVar1->dnum == dungeon_topology.d_sokoban_dnum) && ((ptr_00->mflags1 & 0x10000) == 0)) {
    pmVar16->mtrapseen = 0x1400;
  }
  if (ptr_00->msound == '\x1f') {
    pbVar2 = (byte *)((long)&pmVar16->mtrapseen + 2);
    *pbVar2 = *pbVar2 | 2;
  }
  pmVar16->dlevel = lev;
  place_monster(pmVar16,iVar22,y);
  uVar20 = *(uint *)&pmVar16->field_0x60 | 0x60000;
  *(uint *)&pmVar16->field_0x60 = uVar20;
  uVar15 = 0;
  if ((mmflags & 0x10U) == 0) {
    bVar4 = peace_minded(ptr_00);
    uVar15 = (uint)bVar4 << 0x16;
    uVar20 = *(uint *)&pmVar16->field_0x60;
  }
  uVar12 = uVar20 & 0xffbfffff | uVar15;
  *(uint *)&pmVar16->field_0x60 = uVar12;
  switch(ptr_00->mlet) {
  case '\f':
switchD_001b3e75_caseD_c:
    uVar12 = uVar12 | 0x80000;
LAB_001b4004:
    *(uint *)&pmVar16->field_0x60 = uVar12;
    break;
  case '\r':
    set_mimic_sym(pmVar16,lev);
    break;
  case '\x0e':
    if ((u.uhave._0_1_ & 1) == 0) goto switchD_001b3e75_caseD_c;
    break;
  case '\x0f':
    if (urace.malenum == 0x111) {
      uVar12 = uVar20 & 0xffbfffff | uVar15 & 0xffbfffff;
      goto LAB_001b4004;
    }
    break;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x14':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x1a':
  case '\x1b':
  case '\x1d':
  case '\x1e':
  case ' ':
  case '!':
  case '\"':
  case '#':
    break;
  case '\x13':
switchD_001b3e75_caseD_13:
    if (((in_mklev != '\0') && (iVar22 != 0)) && (y != 0)) {
      mkobj_at('\0',lev,iVar22,y,'\x01');
    }
    if (((ptr_00->mflags1 & 0x80) != 0) && (lev->objects[iVar22][y] != (obj *)0x0)) {
      pmVar16->field_0x60 = pmVar16->field_0x60 | 0x80;
    }
    break;
  case '\x15':
    if ((ptr_00->mflags2 & 0x20000000) != 0) {
      iVar11 = sgn((int)u.ualign.type);
      iVar13 = sgn((int)ptr_00->maligntyp);
      if (iVar11 == iVar13) {
        pmVar16->field_0x62 = pmVar16->field_0x62 | 0x40;
      }
    }
    break;
  case '\x19':
  case '\x1f':
    if ((iVar10 == 0x9e) || (iVar10 == 0x7b)) {
      uVar12 = uVar12 | 10;
      goto LAB_001b4004;
    }
    break;
  case '\x1c':
    bVar3 = In_hell(pdVar1);
    if ((bVar3 != '\0') &&
       (ptr_00 == mons + 0x85 || (ptr_00 == mons + 0x83 || ptr_00 == mons + 0x82))) {
      mon_adjust_speed(pmVar16,2,(obj *)0x0);
    }
    break;
  case '$':
    uVar20 = mt_random();
    if ((uVar20 % 5 != 0) && ((u.uhave._0_1_ & 1) == 0)) {
      pmVar16->field_0x62 = pmVar16->field_0x62 | 8;
    }
    break;
  default:
    if (ptr_00->mlet == '-') goto switchD_001b3e75_caseD_13;
  }
  ppVar18 = pmVar16->data;
  if ((ppVar18 == mons + 0x101 || (ppVar18 == mons + 0x21 || ppVar18 == mons + 0x20)) ||
      ppVar18->mlet == '\x19') {
LAB_001b40ad:
    new_light_source(lev,pmVar16->mx,pmVar16->my,1,1,pmVar16);
  }
  else {
    pcVar17 = mons_mname(ppVar18);
    iVar11 = strcmp(pcVar17,"gold dragon");
    if (iVar11 == 0) goto LAB_001b40ad;
    pcVar17 = mons_mname(pmVar16->data);
    iVar11 = strcmp(pcVar17,"baby gold dragon");
    if ((iVar11 == 0) || (pmVar16->data == mons + 0x73 || pmVar16->data == mons + 0xa0))
    goto LAB_001b40ad;
  }
  uVar20 = pm_to_cham(iVar10);
  if (uVar20 == 0) {
    if (iVar10 == 0x147) {
      flags.djinni_count = flags.djinni_count + 1;
      goto LAB_001b41d7;
    }
    if (iVar10 == 0x12a) {
      flags.ghost_count = flags.ghost_count + 1;
      if ((mmflags & 0x20U) == 0) {
        pcVar17 = rndghostname();
        pmVar16 = christen_monst(pmVar16,pcVar17);
      }
      goto LAB_001b41d7;
    }
    if (iVar10 != 0x128) goto LAB_001b41d7;
    pmVar16->field_0x63 = pmVar16->field_0x63 | 0x20;
    uVar20 = flags.no_of_wizards + 1;
    bVar24 = flags.no_of_wizards != 0;
    flags.no_of_wizards = uVar20;
    if (bVar24) goto LAB_001b41d7;
    bVar3 = on_level(pdVar1,&dungeon_topology.d_earth_level);
    bVar24 = (mmflags & 1U) == 0;
    if ((bVar24) && (bVar3 != '\0')) {
      mongets(pmVar16,0x17d);
      bVar24 = true;
    }
  }
  else {
    if (u.uprops[0x17].extrinsic == 0 && u.uprops[0x17].intrinsic == 0) {
      *(uint *)&pmVar16->field_0x60 = *(uint *)&pmVar16->field_0x60 & 0xffffff8f | (uVar20 & 7) << 4
      ;
      ppVar18 = rndmonst(lev);
      newcham(lev,pmVar16,ppVar18,'\0','\0');
    }
    else {
      *(uint *)&pmVar16->field_0x60 = *(uint *)&pmVar16->field_0x60 & 0xffffff8f;
    }
LAB_001b41d7:
    bVar24 = (mmflags & 1U) == 0;
  }
  if (in_mklev == '\0') {
    if (bVar23 && iVar9 == x) {
      newsym((int)pmVar16->mx,(int)pmVar16->my);
      set_apparxy(lev,pmVar16);
    }
  }
  else if ((ptr_00->mflags2 >> 9 & 1) == 0) {
    if (((iVar10 == 0x56) || (iVar10 == 0x76)) || (iVar10 == 0x14c)) {
LAB_001b4258:
      if (((u.uhave._0_1_ & 1) == 0) && (uVar20 = mt_random(), uVar20 % 5 != 0)) {
        pmVar16->field_0x62 = pmVar16->field_0x62 | 8;
      }
    }
  }
  else if (((iVar10 == 0x56 || (ptr_00->mflags2 & 0x1800) == 0) || (iVar10 == 0x14c)) ||
          (iVar10 == 0x76)) goto LAB_001b4258;
  if (((~ptr_00->mflags2 & 0x1200) == 0) && (ptr_00->msound == '\x1c')) {
    uVar20 = *(uint *)&pmVar16->field_0x60 & 0xffbf7ff5;
    *(uint *)&pmVar16->field_0x60 = uVar20 + 0x40000a;
    if ((uwep != (obj *)0x0) && (uwep->oartifact == '\x01')) {
      pmVar16->mtame = '\0';
      *(uint *)&pmVar16->field_0x60 = uVar20 | 10;
    }
  }
  if (iVar10 == 0x76) {
    iVar9 = get_wormno(lev);
    pmVar16->wormno = (uchar)iVar9;
    if ((uchar)iVar9 != '\0') {
      uVar20 = mt_random();
      initworm(pmVar16,uVar20 % 5);
      iVar9 = count_wsegs(pmVar16);
      if (iVar9 != 0) {
        local_d8 = (xchar)y;
        place_worm_tail_randomly(pmVar16,(xchar)iVar22,local_d8);
      }
    }
  }
  set_malign(pmVar16);
  if (ptr == (permonst *)0x0) {
    uVar8 = ptr_00->geno;
    if ((char)uVar8 < '\0') {
      uVar20 = mt_random();
      if ((uVar20 & 1) == 0) {
        uVar8 = ptr_00->geno;
        goto LAB_001b4334;
      }
      iVar22 = (int)pmVar16->mx;
      iVar9 = (int)pmVar16->my;
LAB_001b4366:
      iVar10 = 3;
    }
    else {
LAB_001b4334:
      if ((uVar8 & 0x40) == 0) goto LAB_001b4375;
      uVar20 = mt_random();
      iVar22 = (int)pmVar16->mx;
      iVar9 = (int)pmVar16->my;
      if (uVar20 % 3 == 0) goto LAB_001b4366;
      iVar10 = 10;
    }
    m_initgrp(pmVar16,lev,iVar22,iVar9,iVar10);
  }
LAB_001b4375:
  if (!bVar24) {
    if (pmVar16->minvent != (obj *)0x0) {
      discard_minvent(pmVar16);
    }
    pmVar16->minvent = (obj *)0x0;
    goto LAB_001b4f68;
  }
  bVar3 = attacktype(ptr_00,0xfe);
  iVar9 = 7;
  if (bVar3 == '\0') goto LAB_001b4f2f;
  ppVar18 = pmVar16->data;
  iVar22 = monsndx(ppVar18);
  bVar3 = on_level(pdVar1,&dungeon_topology.d_rogue_level);
  if (bVar3 != '\0') goto LAB_001b4f2f;
  cVar5 = ppVar18->mlet;
  switch(cVar5) {
  case '.':
    uVar20 = mt_random();
    if ((uVar20 & 1) != 0) goto switchD_001b4a78_default;
    uVar20 = mt_random();
    switch(uVar20 & 3) {
    case 0:
      uVar20 = 0x2c;
      break;
    case 1:
      uVar20 = 0x2b;
      break;
    case 2:
      uVar20 = 0x2e;
      break;
    case 3:
      uVar20 = 0x2d;
    }
    break;
  case '/':
  case '0':
  case '2':
  case '3':
  case '6':
  case '7':
  case '9':
switchD_001b44d6_caseD_2f:
    uVar20 = ppVar18->mflags2;
    goto LAB_001b4a46;
  case '1':
    mongets(pmVar16,0x17);
    uVar20 = 0x26;
    break;
  case '4':
    uVar20 = mt_random();
    if ((uVar20 & 3) == 0) {
      mongets(pmVar16,0x77);
    }
    uVar20 = mt_random();
    if ((uVar20 & 3) != 0) goto switchD_001b4a78_default;
    uVar15 = mt_random();
    uVar20 = 0x17;
    if (uVar15 % 3 == 0) {
      uVar20 = 0x1d;
    }
    break;
  case '5':
    if ((ppVar18->mflags2 >> 10 & 1) != 0) {
      switch(iVar22) {
      case 0x121:
      case 0x125:
        uVar15 = mt_random();
        uVar20 = 0;
        uVar14 = mt_random();
        if (uVar15 % 3 == 0) {
          uVar12 = uVar14 % 0xe + 0x2b;
          uVar15 = mt_random();
          uVar20 = 0x11;
          if ((uVar15 & 1) == 0) {
            uVar20 = 0x17;
          }
        }
        else {
          uVar12 = 10;
          if ((uVar14 & 1) == 0) {
            uVar12 = 0x1d;
          }
        }
        goto LAB_001b4e28;
      case 0x122:
        uVar20 = mt_random();
        uVar12 = 0x40;
        if ((uVar20 & 1) == 0) {
          uVar12 = 0x39;
        }
        break;
      case 0x123:
        uVar20 = mt_random();
        uVar12 = (uint)((uVar20 & 1) == 0) * 2 + 0x24;
        break;
      case 0x124:
      case 0x126:
switchD_001b4942_caseD_124:
        uVar20 = mt_random();
        uVar12 = (uVar20 & 1) * 3 + 0x23;
        break;
      default:
        if (iVar22 == 0x10d) goto switchD_001b4942_caseD_124;
        uVar15 = mt_random();
        uVar12 = mt_random();
        uVar20 = 10;
        if (uVar12 % 7 != 0) {
          uVar20 = 0;
        }
        bVar23 = true;
        uVar12 = 0x11;
        if ((uVar15 & 3) == 0) goto LAB_001b4e28;
        goto LAB_001b4e3b;
      }
      uVar20 = 0;
LAB_001b4e28:
      mongets(pmVar16,uVar12);
      bVar23 = uVar12 != 0x11;
LAB_001b4e3b:
      if ((uVar20 == 0) && (bVar23)) {
        uVar15 = mt_random();
        uVar20 = 0x17;
        if ((uVar15 & 3) == 0) break;
      }
      else if (uVar20 != 0) break;
      goto switchD_001b4a78_default;
    }
    if ((ppVar18->mflags2 & 0x10) != 0) {
      uVar20 = mt_random();
      if ((uVar20 & 1) != 0) {
        uVar20 = mt_random();
        iVar10 = 0x70;
        if ((uVar20 & 1) == 0) {
          iVar10 = 0x7d;
        }
        mongets(pmVar16,iVar10);
      }
      uVar20 = mt_random();
      if ((uVar20 & 1) == 0) {
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          iVar10 = 0x99;
          goto LAB_001b4c1c;
        }
      }
      else {
        iVar10 = 0x48;
LAB_001b4c1c:
        mongets(pmVar16,iVar10);
      }
      uVar20 = mt_random();
      if ((uVar20 & 1) != 0) {
        mongets(pmVar16,0x12);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 2) {
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) {
          mongets(pmVar16,0xb);
LAB_001b4cd0:
          mongets(pmVar16,0x89);
        }
      }
      else if (uVar20 % 3 == 1) {
        mongets(pmVar16,0x25);
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) goto LAB_001b4cd0;
      }
      else {
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          mongets(pmVar16,0x89);
        }
        uVar20 = mt_random();
        if (uVar20 % 3 != 0) {
          mongets(pmVar16,0x1e);
        }
        mongets(pmVar16,0x43);
        m_initthrow(pmVar16,2,0xc);
      }
      if (iVar22 == 0x116) {
        uVar20 = mt_random();
        if ((uVar20 % 3 != 0) ||
           ((in_mklev != '\0' &&
            (bVar3 = on_level(&u.uz,&dungeon_topology.d_earth_level), bVar3 != '\0')))) {
          mongets(pmVar16,0x108);
        }
        uVar20 = mt_random();
        if (uVar20 % 0x32 == 0) {
          uVar20 = 0xec;
          break;
        }
      }
      goto switchD_001b4a78_default;
    }
    if ((ppVar18->msound == '$') ||
       (((byte)(ppVar18->msound - 0x1f) < 2 && (urole.malenum == 0x161)))) {
      poVar19 = mksobj(lev,0x39,'\0','\0');
      if (poVar19 != (obj *)0x0) {
        iVar22 = rnd(3);
        poVar19->spe = (schar)iVar22;
        uVar20 = mt_random();
        if ((uVar20 & 1) == 0) {
          curse(poVar19);
        }
LAB_001b4a12:
        mpickobj(pmVar16,poVar19);
      }
      goto switchD_001b4a78_default;
    }
    if (iVar22 != 0x18e) {
      if (iVar22 == 0x10c) {
        mongets(pmVar16,0x108);
        poVar19 = mksobj(lev,0xe7,'\x01','\0');
        mpickobj(pmVar16,poVar19);
        begin_burn(lev,poVar19,'\0');
      }
      goto switchD_001b4a78_default;
    }
    uVar20 = mt_random();
    if ((uVar20 & 1) != 0) goto switchD_001b4a78_default;
    iVar22 = 8;
    iVar10 = 4;
    goto LAB_001b4aee;
  case '8':
    if (iVar22 == 0x12e) {
      uVar20 = mt_random();
      iVar22 = 0x10;
      if ((uVar20 & 3) == 0) {
        iVar22 = 0x41;
      }
LAB_001b4a30:
      mongets(pmVar16,iVar22);
    }
    else if (iVar22 == 0x13a) {
      mongets(pmVar16,0x41);
      iVar22 = 0x24;
      goto LAB_001b4a30;
    }
    uVar20 = ppVar18->mflags2;
    if ((uVar20 >> 9 & 1) == 0) goto switchD_001b4a78_default;
LAB_001b4a46:
    iVar22 = rnd(((uVar20 >> 0xb & 3) + (uint)((uVar20 >> 0x19 & 1) != 0)) * 2 ^ 0xe);
    switch(iVar22) {
    case 1:
      if ((ppVar18->mflags2 & 0x4000000) == 0) {
LAB_001b4a81:
        iVar22 = 7;
        iVar10 = 0xc;
        goto LAB_001b4aee;
      }
LAB_001b4a88:
      uVar20 = 0x1c;
      break;
    case 2:
      if ((ppVar18->mflags2 & 0x4000000) == 0) {
LAB_001b4abf:
        mongets(pmVar16,0x47);
        iVar22 = 6;
        goto LAB_001b4ad0;
      }
      uVar20 = 0x27;
      break;
    case 3:
switchD_001b4a78_caseD_3:
      mongets(pmVar16,0x42);
      iVar22 = 1;
LAB_001b4ad0:
      iVar10 = 0xc;
LAB_001b4aee:
      m_initthrow(pmVar16,iVar22,iVar10);
      goto switchD_001b4a78_default;
    case 4:
      if ((ppVar18->mflags2 & 0x4000000) == 0) {
        iVar22 = 0x11;
        iVar10 = 3;
        goto LAB_001b4aee;
      }
      uVar20 = 0x26;
      break;
    case 5:
      if ((ppVar18->mflags2 & 0x4000000) == 0) {
        uVar20 = 0x3f;
      }
      else {
        uVar20 = 0x37;
      }
      break;
    default:
      goto switchD_001b4a78_default;
    }
    break;
  case ':':
    if (iVar22 != 0x157) goto switchD_001b4a78_default;
    uVar20 = mt_random();
    if (uVar20 % 7 == 0) {
      uVar20 = mt_random();
      uVar20 = (uint)(uVar20 % 3 == 0) * 8 + 0x10;
    }
    else {
      uVar20 = 10;
    }
    break;
  default:
    if (cVar5 == '\b') {
      if (iVar22 == 0x2c) {
        uVar20 = mt_random();
        mongets(pmVar16,*(int *)(&DAT_0029c6a8 + ((ulong)uVar20 % 3) * 4));
        uVar20 = mt_random();
        if (uVar20 % 10 == 0) {
          mongets(pmVar16,0x70);
        }
        uVar20 = mt_random();
        if (uVar20 % 10 == 0) {
          uVar20 = 0x7f;
          break;
        }
      }
      else if ((ppVar18->mflags2 & 0x20) != 0) {
        uVar20 = mt_random();
        if (uVar20 % 7 != 0) {
          mongets(pmVar16,0x7f);
        }
        uVar20 = mt_random();
        if (uVar20 % 7 != 0) {
          mongets(pmVar16,0x94);
        }
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          mongets(pmVar16,0x20);
          uVar20 = mt_random();
          if ((uVar20 & 1) == 0) {
            mongets(pmVar16,0x1b);
            iVar22 = 0x8d;
          }
          else {
            iVar22 = 0x33;
          }
          mongets(pmVar16,iVar22);
          mongets(pmVar16,0x4a);
          uVar20 = mt_random();
          if (uVar20 % 3 != 0) goto switchD_001b4a78_default;
          uVar20 = 0x6f;
        }
        else {
          uVar15 = mt_random();
          uVar20 = 0x11;
          if (uVar15 % 3 == 0) {
            uVar20 = 0x108;
          }
        }
        break;
      }
      goto switchD_001b4a78_default;
    }
    if (cVar5 == '\v') {
      uVar20 = mt_random();
      if ((uVar20 & 3) != 0) goto switchD_001b4a78_default;
      goto LAB_001b4a81;
    }
    if (cVar5 != '\x0f') {
      if (cVar5 == '\x1b') {
        poVar19 = mksobj(lev,0x26,'\0','\0');
        uVar20 = mt_random();
        if ((uVar20 % 0x14 == 0) || ((ppVar18->mflags2 & 0x800) != 0)) {
          uVar20 = mt_random();
          pcVar17 = artiname((uint)((uVar20 & 1) == 0) * 8 + 0xe);
          poVar19 = oname(poVar19,pcVar17);
          if (poVar19->oartifact == '\0') {
            create_oprop(lev,poVar19,'\0');
          }
        }
        bless(poVar19);
        poVar19->field_0x4b = poVar19->field_0x4b | 0x10;
        uVar20 = mt_random();
        cVar5 = (char)(uVar20 & 3);
        if ((int)(uVar20 & 3) < (int)poVar19->spe) {
          cVar5 = poVar19->spe;
        }
        poVar19->spe = cVar5;
        mpickobj(pmVar16,poVar19);
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          iVar22 = 0x8e;
        }
        else {
          iVar22 = (uint)((*(byte *)((long)&ppVar18->mflags2 + 1) & 8) >> 3) * 2 + 0x8c;
        }
        poVar19 = mksobj(lev,iVar22,'\0','\0');
        *(uint *)&poVar19->field_0x4a = *(uint *)&poVar19->field_0x4a & 0xffffeffe | 0x1000;
        poVar19->spe = '\0';
        goto LAB_001b4a12;
      }
      if (cVar5 == '\x1d') {
        uVar20 = mt_random();
        if ((uVar20 & 1) == 0) goto switchD_001b4a78_default;
        if (ppVar18 == mons + 0x87) goto switchD_001b4a78_caseD_3;
        goto LAB_001b4abf;
      }
      if (cVar5 == '\"') {
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) {
          uVar20 = 0x214;
          if (iVar22 == 0xb4) {
            uVar20 = 0x3c;
          }
          break;
        }
        goto switchD_001b4a78_default;
      }
      if (cVar5 == '%') {
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          m_initthrow(pmVar16,0x120,2);
        }
        uVar20 = mt_random();
        if (uVar20 % 3 == 0) {
          uVar20 = mt_random();
          uVar20 = uVar20 & 1 ^ 0x3d;
          break;
        }
        goto switchD_001b4a78_default;
      }
      if (cVar5 != ')') goto switchD_001b44d6_caseD_2f;
      iVar10 = 0xc;
      if (iVar22 == 0xd2) {
        iVar10 = 6;
      }
      iVar11 = 3;
      if (iVar22 != 0xd3) {
        iVar11 = iVar10;
      }
      iVar22 = rn2(iVar11);
      if (iVar22 != 0) {
        uVar20 = 0x3c;
        break;
      }
      goto LAB_001b4a88;
    }
    uVar20 = mt_random();
    if ((uVar20 & 1) != 0) {
      mongets(pmVar16,0x49);
    }
    switch(iVar22) {
    case 0x4c:
      goto switchD_001b4879_caseD_4c;
    case 0x4d:
switchD_001b4879_caseD_4d:
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x7e);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x1f);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x94);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x44);
        m_initthrow(pmVar16,3,0xc);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = 0x8a;
        goto LAB_001b4efe;
      }
      break;
    case 0x4e:
      break;
    case 0x4f:
      uVar20 = mt_random();
      if ((uVar20 & 1) == 0) goto switchD_001b4879_caseD_4d;
switchD_001b4879_caseD_4c:
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x22);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x8b);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        mongets(pmVar16,0x17);
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = 0x72;
        goto LAB_001b4efe;
      }
      break;
    default:
      uVar20 = mt_random();
      if ((uVar20 & 1) != 0) {
        if (iVar22 == 0x48) {
          uVar20 = 0x13;
        }
        else {
          uVar15 = mt_random();
          uVar20 = 0x13;
          if ((uVar15 & 1) != 0) {
            uVar20 = 0x22;
          }
        }
        goto LAB_001b4efe;
      }
    }
    goto switchD_001b4a78_default;
  }
LAB_001b4efe:
  mongets(pmVar16,uVar20);
switchD_001b4a78_default:
  bVar4 = pmVar16->m_lev;
  uVar20 = mt_random();
  if (uVar20 % 0x4b < (uint)bVar4) {
    iVar22 = rnd_offensive_item(pmVar16);
    mongets(pmVar16,iVar22);
  }
LAB_001b4f2f:
  ppVar18 = pmVar16->data;
  lev_00 = pmVar16->dlevel;
  pdVar1 = &lev_00->z;
  bVar3 = on_level(pdVar1,&dungeon_topology.d_rogue_level);
  if (bVar3 != '\0') goto LAB_001b4f58;
  cVar5 = ppVar18->mlet;
  switch(cVar5) {
  case '!':
    bVar3 = In_mines(pdVar1);
    iVar9 = rn2((uint)(bVar3 == '\0') * 5 + 5);
    if (iVar9 == 0) {
      uVar20 = mt_random();
      iVar9 = ((uVar20 & 3) == 0) + 0xe5;
LAB_001b5432:
      mongets(pmVar16,iVar9);
    }
    break;
  case '\"':
    if (ppVar18 != mons + 0xb6) {
      if ((ppVar18->mflags2 & 0x4000) != 0) {
        iVar9 = rn2((uint)(pmVar16->m_lev >> 1));
        while (bVar23 = iVar9 != 0, iVar9 = iVar9 + -1, bVar23) {
          iVar22 = rnd_class(0x1f0,0x20e);
          poVar19 = mksobj(lev_00,iVar22,'\0','\0');
          uVar20 = mt_random();
          poVar19->quan = (uVar20 & 1) + 3;
          uVar20 = weight(poVar19);
          poVar19->owt = uVar20;
          mpickobj(pmVar16,poVar19);
        }
      }
      break;
    }
    uVar20 = mt_random();
    if ((uVar20 % 3 != 0) &&
       ((in_mklev == '\0' ||
        (bVar3 = on_level(pdVar1,&dungeon_topology.d_earth_level), bVar3 == '\0'))))
    goto LAB_001b544c;
    iVar9 = 0x1cf;
    goto LAB_001b5819;
  case '#':
  case '$':
  case '%':
  case '(':
  case ')':
  case '*':
  case ',':
  case '-':
  case '.':
  case '/':
    break;
  case '&':
    if (ppVar18 == mons + 0xbf) {
      uVar20 = mt_random();
      if (uVar20 % 0xd == 0) {
        uVar20 = mt_random();
        iVar9 = 0x15;
        if (uVar20 % 7 == 0) {
          iVar9 = 0x1c3;
        }
        goto LAB_001b5819;
      }
    }
    else {
      if (ppVar18 != mons + 0xc0) break;
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = mt_random();
        iVar9 = 0x15;
        if (uVar20 % 3 == 0) {
          iVar9 = 0x3e;
        }
        uVar20 = mt_random();
        poVar19 = mksobj(lev_00,iVar9,'\x01',uVar20 % 0xd == 0);
        if (poVar19->spe < '\x02') {
          iVar9 = rnd(3);
          poVar19->spe = (schar)iVar9;
        }
        uVar20 = mt_random();
        if ((uVar20 & 3) == 0) {
          poVar19->field_0x4b = poVar19->field_0x4b | 0x10;
        }
        goto LAB_001b52ce;
      }
    }
    goto LAB_001b544c;
  case '\'':
    uVar20 = mt_random();
    if (uVar20 % 7 != 0) {
      iVar9 = 0x7c;
      goto LAB_001b5432;
    }
    break;
  case '+':
    uVar20 = mt_random();
    if (uVar20 % 0x14 == 0) {
      poVar19 = mksobj(lev_00,0xda,'\0','\0');
      poVar19->spe = '\x01';
      uVar20 = weight(poVar19);
      poVar19->owt = uVar20;
      mpickobj(pmVar16,poVar19);
    }
    break;
  case '0':
    uVar20 = mt_random();
    if ((uVar20 & 1) != 0) {
      bVar4 = pmVar16->m_lev;
      uVar20 = mt_random();
      if (uVar20 % 0x1e < (uint)bVar4) {
        iVar9 = 0x151;
      }
      else {
        iVar9 = 0x150;
      }
      goto LAB_001b5432;
    }
    break;
  case '1':
    if (ppVar18 != mons + 0xed) break;
    poVar19 = mksobj(lev_00,0xb9,'\0','\0');
    curse(poVar19);
LAB_001b52ce:
    mpickobj(pmVar16,poVar19);
    goto LAB_001b544c;
  default:
    if (cVar5 == '\b') {
      if (ppVar18 == mons + 0x143) {
        mongets(pmVar16,0xd9);
        iVar9 = 300;
        goto LAB_001b5819;
      }
      break;
    }
    if (cVar5 == '\f') {
      xVar6 = level_difficulty(pdVar1);
      iVar9 = dice((int)xVar6,0x1e);
      uVar21 = (ulong)iVar9;
LAB_001b52f5:
      mkmonmoney(pmVar16,uVar21);
      break;
    }
    if (cVar5 == '\x0e') {
      uVar20 = mt_random();
      if ((uVar20 & 1) == 0) {
        mongets(pmVar16,0xeb);
      }
      uVar20 = mt_random();
      if ((uVar20 & 1) == 0) {
        iVar9 = 0x138;
        goto LAB_001b5432;
      }
      break;
    }
    if (cVar5 == '8') {
      if (ppVar18 == mons + 0x137) {
        uVar20 = mt_random();
        if ((uVar20 & 3) != 0) goto LAB_001b544c;
        iVar9 = 10;
        goto LAB_001b5819;
      }
      break;
    }
    if (cVar5 != '5') break;
    if ((ppVar18->mflags2 & 0x400) == 0) {
      if (ppVar18 == mons + 0x11a) {
        mongets(pmVar16,0xe2);
        uVar20 = mt_random();
        switch(uVar20 & 3) {
        case 0:
          mongets(pmVar16,0x1d0);
        case 1:
          mongets(pmVar16,0x136);
        case 2:
          mongets(pmVar16,0x131);
        case 3:
          iVar9 = 0x1c4;
        }
        goto LAB_001b5819;
      }
      if ((ppVar18->msound == '$') ||
         (bVar4 = ppVar18->msound - 0x1f, bVar4 < 2 && urole.malenum == 0x161)) {
        uVar20 = mt_random();
        iVar9 = 0x81;
        if (uVar20 % 7 == 0) {
          uVar20 = mt_random();
          iVar9 = (uint)(uVar20 % 3 == 0) * 2 + 0x84;
        }
        mongets(pmVar16,iVar9);
        mongets(pmVar16,0x88);
        uVar20 = mt_random();
        uVar21 = (ulong)(uVar20 % 10 + 0x14);
        goto LAB_001b52f5;
      }
      if (urole.malenum == 0x160 && bVar4 < 2) {
        uVar20 = mt_random();
        iVar9 = (uint)(uVar20 % 0xb == 0) * 5 + 0x81;
        goto LAB_001b5432;
      }
      break;
    }
    iVar10 = monsndx(ppVar18);
    iVar22 = -2;
    switch(iVar10) {
    case 0x11c:
      iVar22 = -1;
      break;
    case 0x121:
    case 0x125:
      iVar22 = 3;
      goto LAB_001b560a;
    case 0x122:
      iVar22 = 0;
      break;
    case 0x123:
    case 0x126:
      goto switchD_001b53b3_caseD_123;
    case 0x124:
      iVar22 = -3;
switchD_001b53b3_caseD_123:
      uVar20 = mt_random();
      if (uVar20 % 5 == 0) break;
      uVar20 = mt_random();
      iVar10 = (uVar20 % 5 == 0) + 0x6a;
      goto LAB_001b563a;
    default:
      if (iVar10 == 0x10d) goto switchD_001b53b3_caseD_123;
    case 0x11d:
    case 0x11e:
    case 0x11f:
    case 0x120:
      uVar20 = monsndx(ppVar18);
      iVar22 = 0;
      warning("odd mercenary %d?",(ulong)uVar20);
    }
    uVar20 = mt_random();
    if (uVar20 % 5 == 0) {
LAB_001b560a:
      uVar20 = mt_random();
      if (uVar20 % 5 == 0) {
        iVar10 = 0x77;
        iVar9 = 2;
      }
      else {
        uVar20 = mt_random();
        iVar9 = 3;
        iVar10 = 0x75 - (uint)(uVar20 % 3 == 0);
      }
    }
    else {
      uVar20 = mt_random();
      iVar10 = (uVar20 % 3 == 0) + 0x6d;
      iVar9 = 6;
    }
LAB_001b563a:
    iVar10 = mongets(pmVar16,iVar10);
    iVar10 = iVar10 + iVar9 + iVar22;
    if (iVar10 < 10) {
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) {
          iVar9 = 0x4e;
          goto LAB_001b5674;
        }
      }
      else {
        iVar9 = 0x50;
LAB_001b5674:
        iVar9 = mongets(pmVar16,iVar9);
        iVar10 = iVar10 + iVar9 + 1;
        if (9 < iVar10) goto LAB_001b572c;
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) {
          iVar9 = 2;
          iVar22 = 0x8c;
          goto LAB_001b56b4;
        }
      }
      else {
        iVar9 = 1;
        iVar22 = 0x88;
LAB_001b56b4:
        iVar22 = mongets(pmVar16,iVar22);
        iVar10 = iVar22 + iVar9 + iVar10;
        if (9 < iVar10) goto LAB_001b572c;
      }
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        uVar20 = mt_random();
        if ((uVar20 & 1) != 0) {
          iVar9 = 2;
          iVar22 = 0x95;
          goto LAB_001b56f2;
        }
      }
      else {
        iVar9 = 1;
        iVar22 = 0x93;
LAB_001b56f2:
        iVar22 = mongets(pmVar16,iVar22);
        if (9 < iVar22 + iVar9 + iVar10) goto LAB_001b572c;
      }
      uVar20 = mt_random();
      iVar9 = 0x8f;
      if (uVar20 % 3 == 0) {
        uVar20 = mt_random();
        iVar9 = 0x83;
        if ((uVar20 & 1) == 0) goto LAB_001b572c;
      }
      mongets(pmVar16,iVar9);
    }
LAB_001b572c:
    if ((ppVar18 == mons + 0x126 || ppVar18 == mons + 0x125) ||
        (ppVar18 == mons + 0x10d || ppVar18 == mons + 0x11c)) {
      if (ppVar18 != mons + 0x125) break;
      uVar20 = mt_random();
      if (uVar20 % 3 != 0) {
        iVar9 = 0xfa;
        goto LAB_001b5819;
      }
      goto LAB_001b544c;
    }
    uVar20 = mt_random();
    if (uVar20 % 3 == 0) {
      mongets(pmVar16,0x127);
    }
    uVar20 = mt_random();
    if ((uVar20 & 1) == 0) {
      mongets(pmVar16,0x128);
    }
    if (ppVar18 != mons + 0x121) {
      uVar20 = mt_random();
      if (uVar20 % 3 == 0) {
        iVar9 = 0x105;
LAB_001b5819:
        mongets(pmVar16,iVar9);
      }
      goto LAB_001b544c;
    }
    goto LAB_001b57cf;
  }
  if (ppVar18 == mons + 0x121) {
LAB_001b57cf:
    uVar20 = mt_random();
    if (uVar20 % 0xd == 0) goto LAB_001b544c;
  }
  else {
LAB_001b544c:
    bVar4 = pmVar16->m_lev;
    uVar20 = mt_random();
    if (uVar20 % 0x32 < (uint)bVar4) {
      iVar9 = rnd_defensive_item(pmVar16);
      mongets(pmVar16,iVar9);
    }
    bVar4 = pmVar16->m_lev;
    uVar20 = mt_random();
    if (uVar20 % 100 < (uint)bVar4) {
      iVar9 = rnd_misc_item(pmVar16);
      mongets(pmVar16,iVar9);
    }
    if ((((ppVar18->mflags2 & 0x10000000) != 0) &&
        (poVar19 = findgold(pmVar16->minvent), poVar19 == (obj *)0x0)) &&
       (uVar20 = mt_random(), uVar20 % 5 == 0)) {
      xVar6 = level_difficulty(pdVar1);
      iVar9 = dice((int)xVar6,(uint)(pmVar16->minvent == (obj *)0x0) * 5 + 5);
      mkmonmoney(pmVar16,(long)iVar9);
    }
  }
LAB_001b4f58:
  m_dowear(lev,pmVar16,'\x01');
LAB_001b4f68:
  if (((mmflags & 2U) == 0) && (uVar8 = ptr_00->mflags3, (uVar8 & 0xc0) != 0)) {
    if ((uVar8 & 0x40) != 0) {
      pbVar2 = (byte *)((long)&pmVar16->mstrategy + 3);
      *pbVar2 = *pbVar2 | 0x20;
    }
    if ((char)uVar8 < '\0') {
      pbVar2 = (byte *)((long)&pmVar16->mstrategy + 3);
      *pbVar2 = *pbVar2 | 0x10;
    }
  }
  if (in_mklev == '\0') {
    newsym((int)pmVar16->mx,(int)pmVar16->my);
  }
  return pmVar16;
}

Assistant:

struct monst *makemon(const struct permonst *ptr,
		      struct level *lev, int x, int y, int mmflags)
{
	struct monst *mtmp;
	int mndx, mcham, ct, mitem, xtyp;
	boolean anymon = (!ptr);
	boolean byyou = (x == u.ux && y == u.uy);
	boolean allow_minvent = ((mmflags & NO_MINVENT) == 0);
	boolean countbirth = ((mmflags & MM_NOCOUNTBIRTH) == 0);
	boolean randpos_success = TRUE;	/* in case we aren't randomly positioning */
	unsigned gpflags = (mmflags & MM_IGNOREWATER) ? MM_IGNOREWATER : 0;

	/* if caller wants random location, do it here */
	if (x == 0 && y == 0) {
		int tryct = 0;	/* careful with bigrooms */
		struct monst fakemon;

		fakemon.data = ptr;	/* set up for goodpos */
		do {
			x = rn1(COLNO - 3, 2);
			y = rn2(ROWNO);
			tryct++;
		} while ((!goodpos(lev, x, y, ptr ? &fakemon : NULL, gpflags) &&
			  tryct <= 100) ||
			 (!in_mklev && tryct <= 50 && cansee(x, y)));
		randpos_success = tryct < 100;
	} else if (byyou && !in_mklev) {
		coord bypos;

		if (enexto_core(&bypos, lev, u.ux, u.uy, ptr, gpflags)) {
			x = bypos.x;
			y = bypos.y;
		} else
			return NULL;
	}

	/* Use adjacent position if chosen place is occupied, or
	 * random positioning was asked for but failed. */
	if (MON_AT(lev, x, y) || !randpos_success) {
		if ((mmflags & MM_ADJACENTOK) != 0) {
			coord bypos;
			if (enexto_core(&bypos, lev, x, y, ptr, gpflags)) {
				x = bypos.x;
				y = bypos.y;
			} else
				return NULL;
		} else 
			return NULL;
	}

	if (ptr){
		mndx = monsndx(ptr);
		/* if you are to make a specific monster and it has
		   already been genocided, return */
		if (mvitals[mndx].mvflags & G_GENOD)
		    return NULL;
	} else {
		/* make a random (common) monster that can survive here.
		 * (the special levels ask for random monsters at specific
		 * positions, causing mass drowning on the medusa level,
		 * for instance.)
		 */
		int tryct = 0;	/* maybe there are no good choices */
		struct monst fakemon;
		do {
			if (!(ptr = rndmonst(lev))) {
			    return NULL;	/* no more monsters! */
			}
			fakemon.data = ptr;	/* set up for goodpos */
		} while (!goodpos(lev, x, y, &fakemon, gpflags) && tryct++ < 50);
		mndx = monsndx(ptr);
	}
	
	if (mndx == quest_info(MS_LEADER))
	    ptr = &pm_leader;
	else if (mndx == quest_info(MS_GUARDIAN))
	    ptr = &pm_guardian;
	else if (mndx == quest_info(MS_NEMESIS))
	    ptr = &pm_nemesis;
	
	propagate(mndx, countbirth, FALSE);

	xtyp = ptr->pxtyp;
	if (mmflags & MM_EDOG)
	    xtyp = MX_EDOG;
	else if (mmflags & MM_EMIN)
	    xtyp = MX_EMIN;
	
	mtmp = newmonst(xtyp, 0);
	mtmp->nmon = lev->monlist;
	lev->monlist = mtmp;
	mtmp->m_id = flags.ident++;
	if (!mtmp->m_id)
	    mtmp->m_id = flags.ident++;	/* ident overflowed */
	set_mon_data(mtmp, ptr, 0);
	
	if (mtmp->data->msound == MS_LEADER)
	    quest_status.leader_m_id = mtmp->m_id;
	mtmp->mnum = mndx;

	mtmp->m_lev = adj_lev(&lev->z, ptr);
	if (is_golem(ptr)) {
	    mtmp->mhpmax = mtmp->mhp = golemhp(mndx);
	} else if (is_rider(ptr)) {
	    /* We want low HP, but a high mlevel so they can attack well
	     *
	     * DSR 10/31/09: What, are you nuts?  They're way too crunchy. */
	    mtmp->mhpmax = mtmp->mhp = 100 + dice(8,8);
	} else if (ptr->mlevel > 49) {
	    /* "special" fixed hp monster
	     * the hit points are encoded in the mlevel in a somewhat strange
	     * way to fit in the 50..127 positive range of a signed character
	     * above the 1..49 that indicate "normal" monster levels */
	    mtmp->mhpmax = mtmp->mhp = 2*(ptr->mlevel - 6);
	    mtmp->m_lev = mtmp->mhp / 4;	/* approximation */
	} else if (ptr->mlet == S_DRAGON && mndx >= PM_GRAY_DRAGON &&
		   In_endgame(&lev->z)) {
	    /* dragons in the endgame are always at least average HP
	     * note modified hit die here as well; they're MZ_GIGANTIC */
	    mtmp->mhpmax = mtmp->mhp = 7 * mtmp->m_lev + dice((int)mtmp->m_lev, 8);
	} else if (!mtmp->m_lev) {
	    mtmp->mhpmax = mtmp->mhp = rnd(4);	/* level 0 monsters are pathetic */
	} else if (ptr->msound == MS_LEADER) {
	    /* Quest Leaders need to be fairly burly */
	    mtmp->mhpmax = mtmp->mhp = 135 + rnd(30);
	} else {
	    /* plain old ordinary monsters; modify hit die based on size;
	     * big-ass critters like mastodons should have big-ass HP, and
	     * small things like bees and locusts should get less */
	    int mhitdie;
	    switch (mtmp->data->msize) {
		case MZ_TINY: mhitdie = 4; break;
		case MZ_SMALL: mhitdie = 6; break;
		case MZ_LARGE: mhitdie = 10; break;
		case MZ_HUGE: mhitdie = 12; break;
		case MZ_GIGANTIC: mhitdie = 15; break;
		case MZ_MEDIUM:
		default:
		    mhitdie = 8;
		    break;
	    }
	    mtmp->mhpmax = mtmp->mhp = dice((int)mtmp->m_lev, mhitdie);
	    if (is_home_elemental(&lev->z, ptr))
		mtmp->mhpmax = (mtmp->mhp *= 3);
	}

	if (is_female(ptr)) mtmp->female = TRUE;
	else if (is_male(ptr)) mtmp->female = FALSE;
	else mtmp->female = rn2(2);	/* ignored for neuters */

	if (In_sokoban(&lev->z) && !mindless(ptr))  /* know about traps here */
	    mtmp->mtrapseen = (1L << (PIT - 1)) | (1L << (HOLE - 1));
	if (ptr->msound == MS_LEADER)		/* leader knows about portal */
	    mtmp->mtrapseen |= (1L << (MAGIC_PORTAL-1));

	mtmp->dlevel = lev;
	place_monster(mtmp, x, y);
	mtmp->mcansee = mtmp->mcanmove = TRUE;
	mtmp->mpeaceful = (mmflags & MM_ANGRY) ? FALSE : peace_minded(ptr);

	switch(ptr->mlet) {
		case S_MIMIC:
			set_mimic_sym(mtmp, lev);
			break;
		case S_SPIDER:
		case S_SNAKE:
			if (in_mklev)
			    if (x && y)
				mkobj_at(0, lev, x, y, TRUE);
			if (hides_under(ptr) && OBJ_AT_LEV(lev, x, y))
			    mtmp->mundetected = TRUE;
			break;
		case S_LIGHT:
		case S_ELEMENTAL:
			if (mndx == PM_STALKER || mndx == PM_BLACK_LIGHT) {
			    mtmp->perminvis = TRUE;
			    mtmp->minvis = TRUE;
			}
			break;
		case S_LEPRECHAUN:
			mtmp->msleeping = 1;
			break;
		case S_JABBERWOCK:
			if (rn2(5) && !u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_NYMPH:
			if (!u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_ORC:
			if (Race_if (PM_ELF)) mtmp->mpeaceful = FALSE;
			break;
		case S_UNICORN:
			if (is_unicorn(ptr) &&
					sgn(u.ualign.type) == sgn(ptr->maligntyp))
				mtmp->mpeaceful = TRUE;
			break;
		case S_BAT:
			if (In_hell(&lev->z) && is_bat(ptr))
			    mon_adjust_speed(mtmp, 2, NULL);
			break;
	}
	if ((ct = emits_light(mtmp->data)) > 0)
		new_light_source(lev, mtmp->mx, mtmp->my, ct,
				 LS_MONSTER, mtmp);
	mitem = 0;	/* extra inventory item for this monster */

	if ((mcham = pm_to_cham(mndx)) != CHAM_ORDINARY) {
		/* If you're protected with a ring, don't create
		 * any shape-changing chameleons -dgk
		 */
		if (Protection_from_shape_changers)
			mtmp->cham = CHAM_ORDINARY;
		else {
			mtmp->cham = mcham;
			newcham(lev, mtmp, rndmonst(lev), FALSE, FALSE);
		}
	} else if (mndx == PM_WIZARD_OF_YENDOR) {
		mtmp->iswiz = TRUE;
		flags.no_of_wizards++;
		if (flags.no_of_wizards == 1 && Is_earthlevel(&lev->z))
			mitem = SPE_DIG;
	} else if (mndx == PM_DJINNI) {
		flags.djinni_count++;
	} else if (mndx == PM_GHOST) {
		flags.ghost_count++;
		if (!(mmflags & MM_NONAME))
			mtmp = christen_monst(mtmp, rndghostname());
	}
	if (mitem && allow_minvent) mongets(mtmp, mitem);

	if (in_mklev) {
		if (((is_ndemon(ptr)) ||
		    (mndx == PM_WUMPUS) ||
		    (mndx == PM_LONG_WORM) ||
		    (mndx == PM_GIANT_EEL)) && !u.uhave.amulet && rn2(5))
			mtmp->msleeping = TRUE;
	} else {
		if (byyou) {
			newsym(mtmp->mx,mtmp->my);
			set_apparxy(lev, mtmp);
		}
	}
	if (is_dprince(ptr) && ptr->msound == MS_BRIBE) {
	    mtmp->mpeaceful = mtmp->minvis = mtmp->perminvis = 1;
	    mtmp->mavenge = 0;
	    if (uwep && uwep->oartifact == ART_EXCALIBUR)
		mtmp->mpeaceful = mtmp->mtame = FALSE;
	}
	if (mndx == PM_LONG_WORM && (mtmp->wormno = get_wormno(lev)) != 0)
	{
	    /* we can now create worms with tails - 11/91 */
	    initworm(mtmp, rn2(5));
	    if (count_wsegs(mtmp)) place_worm_tail_randomly(mtmp, x, y);
	}
	set_malign(mtmp);		/* having finished peaceful changes */
	if (anymon) {
	    if ((ptr->geno & G_SGROUP) && rn2(2)) {
		m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    } else if (ptr->geno & G_LGROUP) {
		if (rn2(3))  m_initlgrp(mtmp, lev, mtmp->mx, mtmp->my);
		else	    m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    }
	}

	if (allow_minvent) {
	    if (is_armed(ptr))
		m_initweap(lev, mtmp);	/* equip with weapons / armor */
	    m_initinv(mtmp);  /* add on a few special items incl. more armor */
	    m_dowear(lev, mtmp, TRUE);
	} else {
	    /* no initial inventory is allowed */
	    if (mtmp->minvent) discard_minvent(mtmp);
	    mtmp->minvent = NULL;    /* caller expects this */
	}
	if ((ptr->mflags3 & M3_WAITMASK) && !(mmflags & MM_NOWAIT)) {
		if (ptr->mflags3 & M3_WAITFORU)
			mtmp->mstrategy |= STRAT_WAITFORU;
		if (ptr->mflags3 & M3_CLOSE)
			mtmp->mstrategy |= STRAT_CLOSE;
	}

	if (!in_mklev)
	    newsym(mtmp->mx,mtmp->my);	/* make sure the mon shows up */

	return mtmp;
}